

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O3

err_t cmdFileBehead(char *name,size_t count)

{
  bool_t bVar1;
  err_t eVar2;
  bool_t bVar3;
  size_t in_RAX;
  file_t file;
  size_t sVar4;
  blob_t blob;
  ulong uVar5;
  ulong offset;
  ulong size;
  size_t c;
  size_t local_38;
  
  local_38 = in_RAX;
  file = fileOpen(name,"r+b");
  if (file == (file_t)0x0) {
    eVar2 = 0xcb;
  }
  else {
    sVar4 = fileSize(file);
    if (sVar4 == 0xffffffffffffffff) {
      eVar2 = 0xcf;
    }
    else {
      eVar2 = 0xd1;
      size = sVar4 - count;
      if (count <= sVar4) {
        blob = blobCreate(0x1000);
        if (blob == (blob_t)0x0) {
          fileClose(file);
          return 0x6e;
        }
        offset = 0;
        do {
          uVar5 = size - offset;
          if (size < offset || uVar5 == 0) {
            blobClose(blob);
            bVar1 = fileTrunc(file,size);
            bVar3 = fileClose(file);
            if (bVar1 == 0) {
              return 0xce;
            }
            if (bVar3 == 0) {
              return 0x67;
            }
            return 0;
          }
          if (0xfff < uVar5) {
            uVar5 = 0x1000;
          }
          local_38 = uVar5;
          bVar1 = fileSeek(file,count + offset,0);
          if (((bVar1 == 0) || (sVar4 = fileRead2(blob,local_38,file), sVar4 != local_38)) ||
             (bVar1 = fileSeek(file,offset,0), bVar1 == 0)) {
            eVar2 = 0xcf;
            break;
          }
          eVar2 = fileWrite(&local_38,blob,local_38,file);
          offset = offset + local_38;
        } while (eVar2 == 0);
        blobClose(blob);
      }
    }
    fileClose(file);
  }
  return eVar2;
}

Assistant:

err_t cmdFileBehead(const char* name, size_t count)
{
	const size_t buf_size = 4096;
	err_t code;
	file_t file;
	size_t size;
	size_t pos;
	void* buf;
	// pre
	ASSERT(strIsValid(name));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (size < count)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// сдвинуть содержимое файла влево
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	for (pos = 0; code == ERR_OK && pos < size - count;)
	{
		size_t c = MIN2(buf_size, size - count - pos);
		if (!fileSeek(file, pos + count, SEEK_SET) ||
			fileRead2(buf, c, file) != c ||
			!fileSeek(file, pos, SEEK_SET))
			code = ERR_FILE_READ;
		else
			code = fileWrite(&c, buf, c, file);
		pos += c;
	}
	cmdBlobClose(buf);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// обрезать файл
	if (!fileTrunc(file, size - count))
		code = ERR_FILE_WRITE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}